

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint64_t tail64_be(void *v,size_t tail)

{
  uint8_t *p;
  size_t tail_local;
  void *v_local;
  undefined8 local_8;
  
  switch((uint)tail & 7) {
  case 0:
    local_8 = CONCAT17(*v,CONCAT16(*(undefined1 *)((long)v + 1),
                                   CONCAT15(*(undefined1 *)((long)v + 2),
                                            CONCAT14(*(undefined1 *)((long)v + 3),
                                                     CONCAT13(*(undefined1 *)((long)v + 4),
                                                              CONCAT12(*(undefined1 *)((long)v + 5),
                                                                       CONCAT11(*(undefined1 *)
                                                                                 ((long)v + 6),
                                                                                *(undefined1 *)
                                                                                 ((long)v + 7)))))))
                      );
    break;
  case 1:
    local_8 = (ulong)*v;
    break;
  case 2:
    local_8 = (ulong)CONCAT11(*v,*(undefined1 *)((long)v + 1));
    break;
  case 3:
    local_8 = (ulong)CONCAT12(*v,CONCAT11(*(undefined1 *)((long)v + 1),*(undefined1 *)((long)v + 2))
                             );
    break;
  case 4:
    local_8 = (ulong)CONCAT13(*v,CONCAT12(*(undefined1 *)((long)v + 1),
                                          CONCAT11(*(undefined1 *)((long)v + 2),
                                                   *(undefined1 *)((long)v + 3))));
    break;
  case 5:
    local_8 = (ulong)CONCAT14(*v,CONCAT13(*(undefined1 *)((long)v + 1),
                                          CONCAT12(*(undefined1 *)((long)v + 2),
                                                   CONCAT11(*(undefined1 *)((long)v + 3),
                                                            *(undefined1 *)((long)v + 4)))));
    break;
  case 6:
    local_8 = (ulong)CONCAT15(*v,CONCAT14(*(undefined1 *)((long)v + 1),
                                          CONCAT13(*(undefined1 *)((long)v + 2),
                                                   CONCAT12(*(undefined1 *)((long)v + 3),
                                                            CONCAT11(*(undefined1 *)((long)v + 4),
                                                                     *(undefined1 *)((long)v + 5))))
                                         ));
    break;
  case 7:
    local_8 = (ulong)CONCAT16(*v,CONCAT15(*(undefined1 *)((long)v + 1),
                                          CONCAT14(*(undefined1 *)((long)v + 2),
                                                   CONCAT13(*(undefined1 *)((long)v + 3),
                                                            CONCAT12(*(undefined1 *)((long)v + 4),
                                                                     CONCAT11(*(undefined1 *)
                                                                               ((long)v + 5),
                                                                              *(undefined1 *)
                                                                               ((long)v + 6)))))));
  }
  return local_8;
}

Assistant:

static maybe_unused __inline uint64_t tail64_be(const void *v, size_t tail) {
  const uint8_t *p = (const uint8_t *)v;
  switch (tail & 7) {
#if UNALIGNED_OK && __BYTE_ORDER__ == __ORDER_BIG_ENDIAN__
  /* For most CPUs this code is better when not needed
   * copying for alignment or byte reordering. */
  case 1:
    return p[0];
  case 2:
    return fetch16_be(p);
  case 3:
    return (uint32_t)fetch16_be(p) << 8 | p[2];
  case 4:
    return fetch32_be(p);
  case 5:
    return (uint64_t)fetch32_be(p) << 8 | p[4];
  case 6:
    return (uint64_t)fetch32_be(p) << 16 | fetch16_be(p + 4);
  case 7:
    return (uint64_t)fetch32_be(p) << 24 | (uint32_t)fetch16_be(p + 4) << 8 |
           p[6];
  case 0:
    return fetch64_be(p);
#else
  /* For most CPUs this code is better than a
   * copying for alignment and/or byte reordering. */
  case 1:
    return p[0];
  case 2:
    return p[1] | (uint32_t)p[0] << 8;
  case 3:
    return p[2] | (uint32_t)p[1] << 8 | (uint32_t)p[0] << 16;
  case 4:
    return p[3] | (uint32_t)p[2] << 8 | (uint32_t)p[1] << 16 |
           (uint32_t)p[0] << 24;
  case 5:
    return p[4] | (uint32_t)p[3] << 8 | (uint32_t)p[2] << 16 |
           (uint32_t)p[1] << 24 | (uint64_t)p[0] << 32;
  case 6:
    return p[5] | (uint32_t)p[4] << 8 | (uint32_t)p[3] << 16 |
           (uint32_t)p[2] << 24 | (uint64_t)p[1] << 32 | (uint64_t)p[0] << 40;
  case 7:
    return p[6] | (uint32_t)p[5] << 8 | (uint32_t)p[4] << 16 |
           (uint32_t)p[3] << 24 | (uint64_t)p[2] << 32 | (uint64_t)p[1] << 40 |
           (uint64_t)p[0] << 48;
  case 0:
    return p[7] | (uint32_t)p[6] << 8 | (uint32_t)p[5] << 16 |
           (uint32_t)p[4] << 24 | (uint64_t)p[3] << 32 | (uint64_t)p[2] << 40 |
           (uint64_t)p[1] << 48 | (uint64_t)p[0] << 56;
#endif
  }
  unreachable();
}